

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

void prf_state_push(prf_state_t *state)

{
  int iVar1;
  void *pvVar2;
  void *in_RDI;
  void *unaff_retaddr;
  matrix4x4_f32_t *m;
  
  *(short *)((long)in_RDI + 0x7e) = *(short *)((long)in_RDI + 0x7e) + 1;
  prf_debug(1,"state pushed to level %d",(ulong)*(ushort *)((long)in_RDI + 0x7e));
  iVar1 = prf_array_count((void *)0x106904);
  if (iVar1 <= (int)(uint)*(ushort *)((long)in_RDI + 0x7e)) {
    pvVar2 = malloc(0x40);
    if (pvVar2 == (void *)0x0) {
      prf_state_reset((prf_state_t *)0x0);
      return;
    }
    pvVar2 = prf_array_append_ptr(unaff_retaddr,in_RDI);
    *(void **)((long)in_RDI + 0x48) = pvVar2;
  }
  memcpy(*(void **)(*(long *)((long)in_RDI + 0x48) + (ulong)*(ushort *)((long)in_RDI + 0x7e) * 8),
         *(void **)(*(long *)((long)in_RDI + 0x48) +
                   (long)(int)(*(ushort *)((long)in_RDI + 0x7e) - 1) * 8),0x40);
  return;
}

Assistant:

void
prf_state_push(
    prf_state_t * state )
{
    assert( state != NULL );

    state->state_push_level++;
    prf_debug( 1, "state pushed to level %d", state->state_push_level );
    if ( prf_array_count( state->matrix ) <= state->state_push_level ) {
        matrix4x4_f32_t * m;
        m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
        if ( m == NULL ) {
            prf_state_reset( state );
            return;
        }
        state->matrix = 
	  (matrix4x4_f32_t **)prf_array_append_ptr( state->matrix, m );
    }
    memcpy( state->matrix[ state->state_push_level ],
        state->matrix[ state->state_push_level - 1 ], sizeof( matrix4x4_f32_t ) );
}